

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

double sat_solver_memory(sat_solver *s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  
  iVar1 = s->cap;
  lVar2 = (long)iVar1;
  if (lVar2 < 1) {
    dVar19 = 728.0;
  }
  else {
    uVar9 = 1;
    if (1 < iVar1 * 2) {
      uVar9 = (ulong)(uint)(iVar1 * 2);
    }
    dVar19 = 728.0;
    lVar10 = 0;
    do {
      lVar11 = (long)*(int *)((long)&s->wlists->cap + lVar10) << 2;
      auVar12._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar12._0_8_ = lVar11;
      auVar12._12_4_ = 0x45300000;
      dVar19 = dVar19 + (auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
      lVar10 = lVar10 + 0x10;
    } while (uVar9 * 0x10 != lVar10);
  }
  lVar11 = lVar2 << 4;
  auVar25._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar25._0_8_ = lVar11;
  auVar25._12_4_ = 0x45300000;
  lVar10 = lVar2 * 4;
  auVar26._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar26._0_8_ = lVar10;
  auVar26._12_4_ = 0x45300000;
  dVar20 = (auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
  auVar27._8_4_ = iVar1 >> 0x1f;
  auVar27._0_8_ = lVar2;
  auVar27._12_4_ = 0x45300000;
  dVar28 = (auVar27._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0);
  lVar2 = lVar2 << 3;
  auVar29._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar29._0_8_ = lVar2;
  auVar29._12_4_ = 0x45300000;
  dVar24 = (auVar29._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  dVar19 = (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0) + dVar19 + dVar20 +
           dVar28 + dVar28 + dVar28 + dVar28 + dVar24;
  if (s->activity2 != (word *)0x0) {
    dVar19 = dVar19 + dVar24;
  }
  if (s->factors != (double *)0x0) {
    dVar19 = dVar19 + dVar24;
  }
  lVar2 = (long)(s->order).cap << 2;
  auVar21._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar21._0_8_ = lVar2;
  auVar21._12_4_ = 0x45300000;
  lVar10 = (long)(s->trail_lim).cap << 2;
  auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar13._0_8_ = lVar10;
  auVar13._12_4_ = 0x45300000;
  lVar11 = (long)(s->tagged).cap << 2;
  auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar14._0_8_ = lVar11;
  auVar14._12_4_ = 0x45300000;
  lVar3 = (long)(s->stack).cap << 2;
  auVar15._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar15._0_8_ = lVar3;
  auVar15._12_4_ = 0x45300000;
  lVar4 = (long)(s->act_vars).cap << 2;
  auVar16._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar16._0_8_ = lVar4;
  auVar16._12_4_ = 0x45300000;
  lVar5 = (long)(s->unit_lits).cap << 2;
  auVar17._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar17._0_8_ = lVar5;
  auVar17._12_4_ = 0x45300000;
  lVar6 = (long)(s->act_clas).cap << 2;
  auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar18._0_8_ = lVar6;
  auVar18._12_4_ = 0x45300000;
  lVar7 = (long)(s->temp_clause).cap << 2;
  auVar22._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar22._0_8_ = lVar7;
  auVar22._12_4_ = 0x45300000;
  lVar8 = (long)(s->conf_final).cap << 2;
  auVar23._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar23._0_8_ = lVar8;
  auVar23._12_4_ = 0x45300000;
  return (double)(1 << ((char)(s->Mem).nPageSize + 2U & 0x1f)) *
         (double)((s->Mem).iPage[0] + (s->Mem).iPage[1] + 2) +
         (auVar23._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) +
         (auVar22._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
         (auVar18._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
         (auVar17._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
         (auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0) +
         (auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) +
         (auVar14._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0) +
         (auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0) +
         (auVar21._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) +
         dVar19 + dVar20 + dVar20 + dVar20 + dVar20;
}

Assistant:

double sat_solver_memory( sat_solver* s )
{
    int i;
    double Mem = sizeof(sat_solver);
    for (i = 0; i < s->cap*2; i++)
        Mem += s->wlists[i].cap * sizeof(int);
    Mem += s->cap * sizeof(veci);     // ABC_FREE(s->wlists   );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->levels   );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->assigns  );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->polarity );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->tags     );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->loads    );
    Mem += s->cap * sizeof(word);     // ABC_FREE(s->activity );
    if ( s->activity2 )
    Mem += s->cap * sizeof(word);     // ABC_FREE(s->activity );
    if ( s->factors )
    Mem += s->cap * sizeof(double);   // ABC_FREE(s->factors  );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->orderpos );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->reasons  );
    Mem += s->cap * sizeof(lit);      // ABC_FREE(s->trail    );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->model    );

    Mem += s->order.cap * sizeof(int);
    Mem += s->trail_lim.cap * sizeof(int);
    Mem += s->tagged.cap * sizeof(int);
//    Mem += s->learned.cap * sizeof(int);
    Mem += s->stack.cap * sizeof(int);
    Mem += s->act_vars.cap * sizeof(int);
    Mem += s->unit_lits.cap * sizeof(int);
    Mem += s->act_clas.cap * sizeof(int);
    Mem += s->temp_clause.cap * sizeof(int);
    Mem += s->conf_final.cap * sizeof(int);
    Mem += Sat_MemMemoryAll( &s->Mem );
    return Mem;
}